

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

bool __thiscall DnsStats::IsRegisteredTLD(DnsStats *this,uint8_t *tld,size_t tld_length)

{
  TldAsKey *pTVar1;
  TldAsKey key;
  TldAsKey local_80;
  
  TldAsKey::TldAsKey(&local_80,tld,tld_length);
  if ((this->registeredTld).tableCount == 0) {
    LoadRegisteredTLD_from_memory(this);
  }
  pTVar1 = BinHash<TldAsKey>::Retrieve(&this->registeredTld,&local_80);
  TldAsKey::~TldAsKey(&local_80);
  return pTVar1 != (TldAsKey *)0x0;
}

Assistant:

bool DnsStats::IsRegisteredTLD(uint8_t* tld, size_t tld_length)
{

    bool isRegistered = false;
    TldAsKey key(tld, tld_length);

    if (registeredTld.GetCount() == 0)
    {
        this->LoadRegisteredTLD_from_memory();
    }

    if (registeredTld.Retrieve(&key) != NULL)
    {
        isRegistered = true;
    }

    return isRegistered;
}